

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# userauth2-client.c
# Opt level: O2

_Bool ssh2_userauth_signflags(ssh2_userauth_state *s,uint *signflags,char **algname)

{
  BinaryPacketProtocol *pBVar1;
  _Bool _Var2;
  uint uVar3;
  ssh_keyalg *psVar4;
  char *pcVar5;
  
  *signflags = 0;
  psVar4 = find_pubkey_alg(*algname);
  if (psVar4 == (ssh_keyalg *)0x0) {
LAB_0011a481:
    _Var2 = false;
  }
  else {
    uVar3 = (*psVar4->supported_flags)(psVar4);
    pBVar1 = (s->ppl).bpp;
    if ((pBVar1->ext_info_rsa_sha512_ok & (byte)((uVar3 & 4) >> 2)) == 0) {
      if (((byte)((uVar3 & 2) >> 1) & pBVar1->ext_info_rsa_sha256_ok) != 1) goto LAB_0011a481;
      uVar3 = 2;
    }
    else {
      uVar3 = 4;
    }
    *signflags = uVar3;
    pcVar5 = (*psVar4->alternate_ssh_id)(psVar4,uVar3);
    *algname = pcVar5;
    _Var2 = true;
  }
  return _Var2;
}

Assistant:

static bool ssh2_userauth_signflags(struct ssh2_userauth_state *s,
                                    unsigned *signflags, const char **algname)
{
    *signflags = 0;                    /* default */

    const ssh_keyalg *alg = find_pubkey_alg(*algname);
    if (!alg)
        return false;          /* we don't know how to upgrade this */

    unsigned supported_flags = ssh_keyalg_supported_flags(alg);

    if (s->ppl.bpp->ext_info_rsa_sha512_ok &&
        (supported_flags & SSH_AGENT_RSA_SHA2_512)) {
        *signflags = SSH_AGENT_RSA_SHA2_512;
    } else if (s->ppl.bpp->ext_info_rsa_sha256_ok &&
               (supported_flags & SSH_AGENT_RSA_SHA2_256)) {
        *signflags = SSH_AGENT_RSA_SHA2_256;
    } else {
        return false;
    }

    *algname = ssh_keyalg_alternate_ssh_id(alg, *signflags);
    return true;
}